

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O1

void __thiscall cppgenerate::Variable::Variable(Variable *this,Variable *other)

{
  this->_vptr_Variable = (_func_int **)&PTR__Variable_00119d50;
  (this->m_type)._M_dataplus._M_p = (pointer)&(this->m_type).field_2;
  (this->m_type)._M_string_length = 0;
  (this->m_type).field_2._M_local_buf[0] = '\0';
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  (this->m_name)._M_string_length = 0;
  (this->m_name).field_2._M_local_buf[0] = '\0';
  (this->m_initializer)._M_dataplus._M_p = (pointer)&(this->m_initializer).field_2;
  (this->m_initializer)._M_string_length = 0;
  (this->m_initializer).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->m_initializer);
  std::__cxx11::string::_M_assign((string *)&this->m_type);
  std::__cxx11::string::_M_assign((string *)&this->m_name);
  return;
}

Assistant:

Variable::Variable( const Variable& other ){
    m_initializer = other.m_initializer;
    m_type = other.m_type;
    m_name = other.m_name;
}